

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# opennurbs_subd.cpp
# Opt level: O0

int ON_SubDComponentId::CompareTypeAndIdAndDirection
              (ON_SubDComponentId *lhs,ON_SubDComponentId *rhs)

{
  byte bVar1;
  byte bVar2;
  uchar rhs_dir;
  uchar lhs_dir;
  int rc;
  ON_SubDComponentId *rhs_local;
  ON_SubDComponentId *lhs_local;
  
  lhs_local._4_4_ = CompareTypeAndId(lhs,rhs);
  if (lhs_local._4_4_ == 0) {
    bVar1 = lhs->m_type_and_dir & 1;
    bVar2 = rhs->m_type_and_dir & 1;
    if (bVar1 < bVar2) {
      lhs_local._4_4_ = -1;
    }
    else if (bVar2 < bVar1) {
      lhs_local._4_4_ = 1;
    }
    else {
      lhs_local._4_4_ = 0;
    }
  }
  return lhs_local._4_4_;
}

Assistant:

int ON_SubDComponentId::CompareTypeAndIdAndDirection(const ON_SubDComponentId& lhs, const ON_SubDComponentId& rhs)
{
  const int rc = CompareTypeAndId(lhs, rhs);
  if (0 != rc)
    return rc;

  // compare dir
  const unsigned char lhs_dir = (lhs.m_type_and_dir & ON_SubDComponentId::bits_dir_mask);
  const unsigned char rhs_dir = (rhs.m_type_and_dir & ON_SubDComponentId::bits_dir_mask);
  if (lhs_dir < rhs_dir)
    return -1;
  if (lhs_dir > rhs_dir)
    return 1;
  return 0;
}